

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O1

vector<rect,_std::allocator<rect>_> * __thiscall
WalkerManager::GetRectFromManager
          (vector<rect,_std::allocator<rect>_> *__return_storage_ptr__,WalkerManager *this)

{
  long lVar1;
  pointer psVar2;
  long lVar3;
  ulong uVar4;
  value_type local_38;
  
  (__return_storage_ptr__->super__Vector_base<rect,_std::allocator<rect>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<rect,_std::allocator<rect>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<rect,_std::allocator<rect>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar2 = (this->walkers).
           super__Vector_base<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->walkers).
      super__Vector_base<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != psVar2) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      lVar1 = *(long *)(*(long *)((long)&(psVar2->
                                         super___shared_ptr<MWakler,_(__gnu_cxx::_Lock_policy)2>).
                                         _M_ptr + lVar3) + 0x10);
      local_38._0_8_ = *(undefined8 *)(lVar1 + -0x10);
      local_38._8_8_ = *(undefined8 *)(lVar1 + -8);
      std::vector<rect,_std::allocator<rect>_>::push_back(__return_storage_ptr__,&local_38);
      uVar4 = uVar4 + 1;
      psVar2 = (this->walkers).
               super__Vector_base<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < (ulong)((long)(this->walkers).
                                   super__Vector_base<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<rect> GetRectFromManager()
    {
        std::vector<rect> retcts;
        //retcts.resize(walkers.size());

        for(int i=0; i<walkers.size(); ++i)
        {
            Mrect r = walkers.at(i)->mRects.back();
            rect r_t{r.x1, r.y1, r.x2, r.y2};
            retcts.push_back(r_t);
        }
        return retcts;
    }